

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

bool __thiscall
vkt::texture::SampleVerifier::verifySampleImpl
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,ostream *report)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  Vector<float,_4> local_d0;
  Vector<float,_2> local_c0;
  Vec2 dPdyFace;
  Vec2 dPdxFace;
  Vec2 coordFace;
  bool isPossible;
  int faceNdx;
  int faceBitmap;
  Vec3 drdy;
  Vec3 drdx;
  Vec3 r;
  Vec4 dPdy;
  Vec4 dPdx;
  int local_44;
  float proj;
  int coordSize;
  Vec4 coord;
  ostream *report_local;
  Vec4 *result_local;
  SampleArguments *args_local;
  SampleVerifier *this_local;
  
  coord.m_data._8_8_ = report;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&proj,&args->coord);
  local_44 = 0;
  if (this->m_imParams->dim == IMG_DIM_1D) {
    local_44 = 1;
  }
  else if (this->m_imParams->dim == IMG_DIM_2D) {
    local_44 = 2;
  }
  else if ((this->m_imParams->dim == IMG_DIM_3D) || (this->m_imParams->dim == IMG_DIM_CUBE)) {
    local_44 = 3;
  }
  if ((this->m_sampleLookupSettings->isProjective & 1U) != 0) {
    pfVar4 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&proj,local_44);
    tcu::operator/((tcu *)(dPdx.m_data + 2),(Vector<float,_4> *)&proj,*pfVar4);
    proj = dPdx.m_data[2];
    coordSize = (int)dPdx.m_data[3];
  }
  if (this->m_sampleLookupSettings->lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(dPdy.m_data + 2),&args->dPdx);
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(dPdy.m_data + 2),0.0);
  }
  if (this->m_sampleLookupSettings->lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(r.m_data + 1),&args->dPdy);
  }
  else {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(r.m_data + 1),0.0);
  }
  if (this->m_imParams->dim == IMG_DIM_CUBE) {
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(drdx.m_data + 1),(int)&proj,0,1);
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(drdy.m_data + 1),(int)&dPdy + 8,0,1);
    tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&faceNdx,(int)&r + 4,0,1);
    uVar3 = util::calcCandidateCubemapFaces((Vec3 *)(drdx.m_data + 1));
    for (coordFace.m_data[1] = 0.0; (int)coordFace.m_data[1] < 6;
        coordFace.m_data[1] = (float)((int)coordFace.m_data[1] + 1)) {
      if ((uVar3 & 1 << (SUB41(coordFace.m_data[1],0) & 0x1f)) != 0) {
        tcu::Vector<float,_2>::Vector(&dPdxFace);
        tcu::Vector<float,_2>::Vector(&dPdyFace);
        tcu::Vector<float,_2>::Vector(&local_c0);
        util::calcCubemapFaceCoords
                  ((Vec3 *)(drdx.m_data + 1),(Vec3 *)(drdy.m_data + 1),(Vec3 *)&faceNdx,
                   (int)coordFace.m_data[1],&dPdxFace,&dPdyFace,&local_c0);
        pfVar4 = tcu::Vector<float,_2>::operator[](&dPdxFace,0);
        fVar1 = *pfVar4;
        pfVar4 = tcu::Vector<float,_2>::operator[](&dPdxFace,1);
        tcu::Vector<float,_4>::Vector(&local_d0,fVar1,*pfVar4,0.0,0.0);
        pfVar4 = tcu::Vector<float,_2>::operator[](&dPdyFace,0);
        fVar1 = *pfVar4;
        pfVar4 = tcu::Vector<float,_2>::operator[](&dPdyFace,1);
        tcu::Vector<float,_4>::Vector(&local_e0,fVar1,*pfVar4,0.0,0.0);
        pfVar4 = tcu::Vector<float,_2>::operator[](&local_c0,0);
        fVar1 = *pfVar4;
        pfVar4 = tcu::Vector<float,_2>::operator[](&local_c0,1);
        tcu::Vector<float,_4>::Vector(&local_f0,fVar1,*pfVar4,0.0,0.0);
        bVar2 = verifySampleCubemapFace
                          (this,args,result,&local_d0,&local_e0,&local_f0,(int)coordFace.m_data[1],
                           (ostream *)coord.m_data._8_8_);
        if (bVar2) {
          return true;
        }
      }
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         verifySampleCubemapFace
                   (this,args,result,(Vec4 *)&proj,(Vec4 *)(dPdy.m_data + 2),(Vec4 *)(r.m_data + 1),
                    0,(ostream *)coord.m_data._8_8_);
  }
  return this_local._7_1_;
}

Assistant:

bool SampleVerifier::verifySampleImpl (const SampleArguments&	args,
									   const Vec4&				result,
									   std::ostream&			report) const
{
	// \todo [2016-07-11 collinbaker] Handle depth and stencil formats
	// \todo [2016-07-06 collinbaker] Handle dRef
	DE_ASSERT(m_samplerParams.isCompare == false);

	Vec4	coord	  = args.coord;
	int coordSize = 0;

	if (m_imParams.dim == IMG_DIM_1D)
	{
		coordSize = 1;
	}
	else if (m_imParams.dim == IMG_DIM_2D)
	{
		coordSize = 2;
	}
	else if (m_imParams.dim == IMG_DIM_3D || m_imParams.dim == IMG_DIM_CUBE)
	{
		coordSize = 3;
	}

	// 15.6.1 Project operation

	if (m_sampleLookupSettings.isProjective)
	{
		DE_ASSERT(args.coord[coordSize] != 0.0f);
		const float proj = coord[coordSize];

		coord = coord / proj;
	}

	const Vec4 dPdx = (m_sampleLookupSettings.lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) ? args.dPdx : Vec4(0);
	const Vec4 dPdy = (m_sampleLookupSettings.lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) ? args.dPdy : Vec4(0);

	// 15.6.3 Cube Map Face Selection and Transformations

	if (m_imParams.dim == IMG_DIM_CUBE)
	{
		const Vec3	r		   = coord.swizzle(0, 1, 2);
		const Vec3	drdx	   = dPdx.swizzle(0, 1, 2);
		const Vec3	drdy	   = dPdy.swizzle(0, 1, 2);

	    int			faceBitmap = calcCandidateCubemapFaces(r);

		// We must test every possible disambiguation order

		for (int faceNdx = 0; faceNdx < 6; ++faceNdx)
		{
			const bool isPossible = ((faceBitmap & (1U << faceNdx)) != 0);

		    if (!isPossible)
			{
				continue;
			}

			Vec2 coordFace;
			Vec2 dPdxFace;
			Vec2 dPdyFace;

			calcCubemapFaceCoords(r, drdx, drdy, faceNdx, coordFace, dPdxFace, dPdyFace);

			if (verifySampleCubemapFace(args,
										result,
										Vec4(coordFace[0], coordFace[1], 0.0f, 0.0f),
										Vec4(dPdxFace[0], dPdxFace[1], 0.0f, 0.0f),
										Vec4(dPdyFace[0], dPdyFace[1], 0.0f, 0.0f),
										faceNdx,
										report))
			{
				return true;
			}
		}

		return false;
	}
	else
	{
		return verifySampleCubemapFace(args, result, coord, dPdx, dPdy, 0, report);
	}
}